

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

int luaO_utf8esc(char *buff,unsigned_long x)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (x >> 0x1f == 0) {
    if (x < 0x80) {
      iVar2 = 1;
      lVar3 = 7;
    }
    else {
      uVar4 = 0x3f;
      lVar3 = 0x700000000;
      lVar5 = 0;
      do {
        bVar1 = (byte)x;
        lVar3 = lVar3 + -0x100000000;
        x = x >> 6;
        uVar4 = uVar4 >> 1;
        buff[lVar5 + 7] = bVar1 & 0x3f | 0x80;
        lVar5 = lVar5 + -1;
      } while (uVar4 < x);
      lVar3 = lVar3 >> 0x20;
      iVar2 = 1 - (int)lVar5;
      x = x | ~(uint)uVar4 * 2;
    }
    buff[lVar3] = (char)x;
    return iVar2;
  }
  __assert_fail("x <= 0x7FFFFFFFu",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x15e,"int luaO_utf8esc(char *, unsigned long)");
}

Assistant:

int luaO_utf8esc (char *buff, unsigned long x) {
  int n = 1;  /* number of bytes put in buffer (backwards) */
  lua_assert(x <= 0x7FFFFFFFu);
  if (x < 0x80)  /* ascii? */
    buff[UTF8BUFFSZ - 1] = cast_char(x);
  else {  /* need continuation bytes */
    unsigned int mfb = 0x3f;  /* maximum that fits in first byte */
    do {  /* add continuation bytes */
      buff[UTF8BUFFSZ - (n++)] = cast_char(0x80 | (x & 0x3f));
      x >>= 6;  /* remove added bits */
      mfb >>= 1;  /* now there is one less bit available in first byte */
    } while (x > mfb);  /* still needs continuation byte? */
    buff[UTF8BUFFSZ - n] = cast_char((~mfb << 1) | x);  /* add first byte */
  }
  return n;
}